

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O1

OPJ_BOOL opj_t2_encode_packet
                   (OPJ_UINT32 tileno,opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,
                   OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 length,
                   opj_codestream_info_t *cstr_info,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager
                   )

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  opj_tcd_resolution_t *poVar4;
  opj_tcd_precinct_t *poVar5;
  opj_packet_info_t *poVar6;
  bool bVar7;
  OPJ_BOOL OVar8;
  uint uVar9;
  opj_bio_t *bio;
  ulong uVar10;
  ulong uVar11;
  opj_tcd_pass_t *poVar12;
  int iVar13;
  OPJ_UINT32 OVar14;
  uint uVar15;
  opj_tcd_band_t *poVar16;
  opj_tcd_layer_t *poVar17;
  ulong uVar18;
  OPJ_UINT32 OVar19;
  int iVar20;
  uint uVar21;
  OPJ_UINT32 v;
  opj_tcd_band_t *band;
  int iVar22;
  undefined8 uVar23;
  opj_tcd_cblk_enc_t *poVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  OPJ_UINT32 *pOVar28;
  uint uVar29;
  opj_tcd_cblk_dec_t *poVar30;
  double dVar31;
  OPJ_UINT32 local_c4;
  OPJ_BYTE *local_c0;
  uint local_94;
  
  uVar2 = pi->resno;
  uVar3 = pi->precno;
  uVar21 = pi->layno;
  uVar11 = (ulong)uVar21;
  poVar4 = tile->comps[pi->compno].resolutions;
  local_c0 = dest;
  if ((tcp->csty & 2) != 0) {
    if (length < 6) {
      if (p_t2_mode != FINAL_PASS) {
        return 0;
      }
      uVar23 = 6;
      goto LAB_00135569;
    }
    dest[0] = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    dest[4] = *(OPJ_BYTE *)((long)&tile->packno + 1);
    dest[5] = (OPJ_BYTE)tile->packno;
    length = length - 6;
    local_c0 = dest + 6;
  }
  if ((uVar11 == 0) && (poVar4[uVar2].numbands != 0)) {
    poVar16 = poVar4[uVar2].bands;
    uVar29 = 0;
    do {
      OVar8 = opj_tcd_is_band_empty(poVar16);
      if (OVar8 == 0) {
        poVar5 = poVar16->precincts;
        opj_tgt_reset(poVar5[uVar3].incltree);
        opj_tgt_reset(poVar5[uVar3].imsbtree);
        uVar9 = poVar5[uVar3].ch * poVar5[uVar3].cw;
        if (uVar9 != 0) {
          lVar26 = 0x34;
          uVar27 = 0;
          do {
            poVar24 = poVar5[uVar3].cblks.enc;
            *(undefined4 *)((long)&poVar24->data + lVar26) = 0;
            opj_tgt_setvalue(poVar5[uVar3].imsbtree,(OPJ_UINT32)uVar27,
                             poVar16->numbps - *(int *)((long)poVar24 + lVar26 + -0xc));
            uVar27 = uVar27 + 1;
            lVar26 = lVar26 + 0x40;
          } while (uVar9 != uVar27);
        }
      }
      uVar29 = uVar29 + 1;
      poVar16 = poVar16 + 1;
    } while (uVar29 < poVar4[uVar2].numbands);
  }
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
    return 0;
  }
  opj_bio_init_enc(bio,local_c0,length);
  opj_bio_write(bio,1,1);
  poVar16 = poVar4[uVar2].bands;
  if (poVar4[uVar2].numbands != 0) {
    local_94 = 0;
    band = poVar16;
    do {
      OVar8 = opj_tcd_is_band_empty(band);
      if (OVar8 == 0) {
        poVar5 = band->precincts;
        OVar19 = poVar5[uVar3].ch * poVar5[uVar3].cw;
        if (OVar19 != 0) {
          pOVar28 = &(poVar5[uVar3].cblks.enc)->numpasses;
          OVar14 = 0;
          do {
            if ((*pOVar28 == 0) && ((*(opj_tcd_layer_t **)(pOVar28 + -0xb))[uVar11].numpasses != 0))
            {
              opj_tgt_setvalue(poVar5[uVar3].incltree,OVar14,uVar21);
            }
            OVar14 = OVar14 + 1;
            pOVar28 = pOVar28 + 0x10;
          } while (OVar19 != OVar14);
          poVar24 = poVar5[uVar3].cblks.enc;
          local_c4 = 0;
          do {
            poVar17 = poVar24->layers + uVar11;
            if (poVar24->numpasses == 0) {
              opj_tgt_encode(bio,poVar5[uVar3].incltree,local_c4,uVar21 + 1);
            }
            else {
              opj_bio_write(bio,(uint)(poVar17->numpasses != 0),1);
            }
            if (poVar17->numpasses != 0) {
              if (poVar24->numpasses == 0) {
                poVar24->numlenbits = 3;
                opj_tgt_encode(bio,poVar5[uVar3].imsbtree,local_c4,999);
              }
              uVar29 = poVar17->numpasses;
              if (uVar29 == 2) {
                v = 2;
                OVar14 = 2;
LAB_00135336:
                opj_bio_write(bio,v,OVar14);
              }
              else {
                if (uVar29 == 1) {
                  v = 0;
                  OVar14 = 1;
                  goto LAB_00135336;
                }
                if (uVar29 < 6) {
                  v = uVar29 - 3 | 0xc;
                  OVar14 = 4;
                  goto LAB_00135336;
                }
                if (uVar29 < 0x25) {
                  v = uVar29 - 6 | 0x1e0;
                  OVar14 = 9;
                  goto LAB_00135336;
                }
                if (uVar29 < 0xa5) {
                  v = uVar29 - 0x25 | 0xff80;
                  OVar14 = 0x10;
                  goto LAB_00135336;
                }
              }
              uVar29 = poVar24->numpasses;
              uVar10 = (ulong)uVar29;
              uVar25 = poVar17->numpasses + uVar29;
              iVar13 = 0;
              uVar27 = 0;
              uVar9 = 0;
              if (uVar29 < uVar25) {
                poVar12 = poVar24->passes + uVar10;
                uVar9 = 0;
                uVar27 = 0;
                iVar13 = 0;
                do {
                  uVar29 = (int)uVar27 + 1;
                  uVar27 = (ulong)uVar29;
                  uVar9 = uVar9 + poVar12->len;
                  if (((int)uVar10 == uVar25 - 1) || ((poVar12->field_0x14 & 1) != 0)) {
                    iVar20 = 1;
                    if (1 < (int)uVar9) {
                      do {
                        iVar20 = iVar20 + 1;
                        bVar7 = 3 < uVar9;
                        uVar9 = uVar9 >> 1;
                      } while (bVar7);
                    }
                    iVar22 = 0;
                    if (1 < (int)uVar29) {
                      iVar22 = 0;
                      do {
                        iVar22 = iVar22 + -1;
                        uVar29 = (uint)uVar27;
                        uVar27 = uVar27 >> 1;
                      } while (3 < uVar29);
                    }
                    iVar22 = (iVar20 - poVar24->numlenbits) + iVar22;
                    if (iVar13 <= iVar22) {
                      iVar13 = iVar22;
                    }
                    uVar9 = 0;
                    uVar27 = 0;
                  }
                  poVar12 = poVar12 + 1;
                  uVar29 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar29;
                } while (uVar29 != uVar25);
              }
              if (0 < iVar13) {
                iVar20 = iVar13 + 1;
                do {
                  opj_bio_write(bio,1,1);
                  iVar20 = iVar20 + -1;
                } while (1 < iVar20);
              }
              opj_bio_write(bio,0,1);
              poVar24->numlenbits = poVar24->numlenbits + iVar13;
              uVar10 = (ulong)poVar24->numpasses;
              if (poVar24->numpasses < uVar25) {
                poVar12 = poVar24->passes + uVar10;
                do {
                  uVar29 = (int)uVar27 + 1;
                  uVar18 = (ulong)uVar29;
                  uVar9 = uVar9 + poVar12->len;
                  if (((poVar12->field_0x14 & 1) != 0) ||
                     (uVar27 = uVar18, (int)uVar10 == poVar24->numpasses + poVar17->numpasses + -1))
                  {
                    uVar27 = 0;
                    iVar13 = 0;
                    if (1 < (int)uVar29) {
                      iVar13 = 0;
                      do {
                        uVar29 = uVar29 >> 1;
                        iVar13 = iVar13 + 1;
                        uVar15 = (uint)uVar18;
                        uVar18 = (ulong)uVar29;
                      } while (3 < uVar15);
                    }
                    opj_bio_write(bio,uVar9,iVar13 + poVar24->numlenbits);
                    uVar9 = 0;
                  }
                  poVar12 = poVar12 + 1;
                  uVar29 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar29;
                } while (uVar29 != uVar25);
              }
            }
            poVar24 = poVar24 + 1;
            local_c4 = local_c4 + 1;
          } while (local_c4 != OVar19);
        }
      }
      local_94 = local_94 + 1;
      band = band + 1;
    } while (local_94 < poVar4[uVar2].numbands);
  }
  OVar8 = opj_bio_flush(bio);
  if (OVar8 == 0) {
    opj_bio_destroy(bio);
    return 0;
  }
  uVar27 = opj_bio_numbytes(bio);
  local_c0 = local_c0 + (uVar27 & 0xffffffff);
  length = length - (int)uVar27;
  opj_bio_destroy(bio);
  if ((tcp->csty & 4) != 0) {
    if (length < 2) {
      if (p_t2_mode != FINAL_PASS) {
        return 0;
      }
      uVar23 = 2;
LAB_00135569:
      opj_event_msg(p_manager,1,
                    "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                    ,(ulong)length,uVar23);
      return 0;
    }
    local_c0[0] = 0xff;
    local_c0[1] = 0x92;
    local_c0 = local_c0 + 2;
    length = length - 2;
  }
  if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
    cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos = (long)((int)local_c0 - (int)dest)
    ;
  }
  if (poVar4[uVar2].numbands != 0) {
    uVar21 = 0;
    do {
      OVar8 = opj_tcd_is_band_empty(poVar16);
      iVar13 = 0x19;
      if (OVar8 == 0) {
        poVar5 = poVar16->precincts;
        iVar20 = poVar5[uVar3].ch * poVar5[uVar3].cw;
        if (iVar20 != 0) {
          poVar30 = poVar5[uVar3].cblks.dec;
          do {
            if (*(int *)((long)poVar30->chunks + uVar11 * 0x18) == 0) {
              poVar30 = (opj_tcd_cblk_dec_t *)&poVar30->decoded_data;
              iVar13 = 0x1c;
            }
            else {
              piVar1 = (int *)((long)poVar30->chunks + uVar11 * 0x18);
              if (length < (uint)piVar1[1]) {
                iVar13 = 1;
                if (p_t2_mode == FINAL_PASS) {
                  opj_event_msg(p_manager,1,
                                "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                               );
                }
              }
              else {
                memcpy(local_c0,*(void **)(piVar1 + 4),(ulong)(uint)piVar1[1]);
                poVar30->m_current_max_segs = poVar30->m_current_max_segs + *piVar1;
                uVar29 = piVar1[1];
                if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                  poVar6 = cstr_info->tile[tileno].packet;
                  dVar31 = *(double *)(piVar1 + 2) + poVar6[cstr_info->packno].disto;
                  poVar6[cstr_info->packno].disto = dVar31;
                  if (cstr_info->D_max <= dVar31 && dVar31 != cstr_info->D_max) {
                    cstr_info->D_max = dVar31;
                  }
                }
                local_c0 = local_c0 + uVar29;
                length = length - uVar29;
                poVar30 = (opj_tcd_cblk_dec_t *)&poVar30->decoded_data;
                iVar13 = 0;
              }
            }
            if ((iVar13 != 0x1c) && (iVar13 != 0)) goto LAB_0013574f;
            iVar20 = iVar20 + -1;
          } while (iVar20 != 0);
        }
        iVar13 = 0;
      }
LAB_0013574f:
      if ((iVar13 != 0x19) && (iVar13 != 0)) {
        return 0;
      }
      uVar21 = uVar21 + 1;
      poVar16 = poVar16 + 1;
    } while (uVar21 < poVar4[uVar2].numbands);
  }
  if (local_c0 < dest) {
    __assert_fail("c >= dest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t2.c"
                  ,0x3bb,
                  "OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32, opj_tcd_tile_t *, opj_tcp_t *, opj_pi_iterator_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, J2K_T2_MODE, opj_event_mgr_t *)"
                 );
  }
  *p_data_written = *p_data_written + ((int)local_c0 - (int)dest);
  return 1;
}

Assistant:

static OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32 tileno,
                                     opj_tcd_tile_t * tile,
                                     opj_tcp_t * tcp,
                                     opj_pi_iterator_t *pi,
                                     OPJ_BYTE *dest,
                                     OPJ_UINT32 * p_data_written,
                                     OPJ_UINT32 length,
                                     opj_codestream_info_t *cstr_info,
                                     J2K_T2_MODE p_t2_mode,
                                     opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 bandno, cblkno;
    OPJ_BYTE* c = dest;
    OPJ_UINT32 l_nb_bytes;
    OPJ_UINT32 compno = pi->compno;     /* component value */
    OPJ_UINT32 resno  = pi->resno;      /* resolution level value */
    OPJ_UINT32 precno = pi->precno;     /* precinct value */
    OPJ_UINT32 layno  = pi->layno;      /* quality layer value */
    OPJ_UINT32 l_nb_blocks;
    opj_tcd_band_t *band = 00;
    opj_tcd_cblk_enc_t* cblk = 00;
    opj_tcd_pass_t *pass = 00;

    opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
    opj_tcd_resolution_t *res = &tilec->resolutions[resno];

    opj_bio_t *bio = 00;    /* BIO component */
#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    OPJ_BOOL packet_empty = OPJ_TRUE;
#else
    OPJ_BOOL packet_empty = OPJ_FALSE;
#endif

    /* <SOP 0xff91> */
    if (tcp->csty & J2K_CP_CSTY_SOP) {
        if (length < 6) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 6);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 145;
        c[2] = 0;
        c[3] = 4;
#if 0
        c[4] = (tile->packno % 65536) / 256;
        c[5] = (tile->packno % 65536) % 256;
#else
        c[4] = (tile->packno >> 8) & 0xff; /* packno is uint32_t */
        c[5] = tile->packno & 0xff;
#endif
        c += 6;
        length -= 6;
    }
    /* </SOP> */

    if (!layno) {
        band = res->bands;

        for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
            opj_tcd_precinct_t *prc;

            /* Skip empty bands */
            if (opj_tcd_is_band_empty(band)) {
                continue;
            }

            prc = &band->precincts[precno];
            opj_tgt_reset(prc->incltree);
            opj_tgt_reset(prc->imsbtree);

            l_nb_blocks = prc->cw * prc->ch;
            for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
                cblk = &prc->cblks.enc[cblkno];

                cblk->numpasses = 0;
                opj_tgt_setvalue(prc->imsbtree, cblkno, band->numbps - (OPJ_INT32)cblk->numbps);
            }
        }
    }

    bio = opj_bio_create();
    if (!bio) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    opj_bio_init_enc(bio, c, length);

#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    /* WARNING: this code branch is disabled, since it has been reported that */
    /* such packets cause decoding issues with cinema J2K hardware */
    /* decoders: https://groups.google.com/forum/#!topic/openjpeg/M7M_fLX_Bco */

    /* Check if the packet is empty */
    /* Note: we could also skip that step and always write a packet header */
    band = res->bands;
    for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
        opj_tcd_precinct_t *prc;
        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++, ++cblk) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                continue;
            }
            packet_empty = OPJ_FALSE;
            break;
        }
        if (!packet_empty) {
            break;
        }
    }
#endif
    opj_bio_write(bio, packet_empty ? 0 : 1, 1);           /* Empty header bit */

    /* Writing Packet header */
    band = res->bands;
    for (bandno = 0; !packet_empty &&
            bandno < res->numbands; ++bandno, ++band)      {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!cblk->numpasses && layer->numpasses) {
                opj_tgt_setvalue(prc->incltree, cblkno, (OPJ_INT32)layno);
            }

            ++cblk;
        }

        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];
            OPJ_UINT32 increment = 0;
            OPJ_UINT32 nump = 0;
            OPJ_UINT32 len = 0, passno;
            OPJ_UINT32 l_nb_passes;

            /* cblk inclusion bits */
            if (!cblk->numpasses) {
                opj_tgt_encode(bio, prc->incltree, cblkno, (OPJ_INT32)(layno + 1));
            } else {
                opj_bio_write(bio, layer->numpasses != 0, 1);
            }

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            /* if first instance of cblk --> zero bit-planes information */
            if (!cblk->numpasses) {
                cblk->numlenbits = 3;
                opj_tgt_encode(bio, prc->imsbtree, cblkno, 999);
            }

            /* number of coding passes included */
            opj_t2_putnumpasses(bio, layer->numpasses);
            l_nb_passes = cblk->numpasses + layer->numpasses;
            pass = cblk->passes +  cblk->numpasses;

            /* computation of the increase of the length indicator and insertion in the header     */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                ++nump;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    increment = (OPJ_UINT32)opj_int_max((OPJ_INT32)increment,
                                                        opj_int_floorlog2((OPJ_INT32)len) + 1
                                                        - ((OPJ_INT32)cblk->numlenbits + opj_int_floorlog2((OPJ_INT32)nump)));
                    len = 0;
                    nump = 0;
                }

                ++pass;
            }
            opj_t2_putcommacode(bio, (OPJ_INT32)increment);

            /* computation of the new Length indicator */
            cblk->numlenbits += increment;

            pass = cblk->passes +  cblk->numpasses;
            /* insertion of the codeword segment length */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                nump++;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    opj_bio_write(bio, (OPJ_UINT32)len,
                                  cblk->numlenbits + (OPJ_UINT32)opj_int_floorlog2((OPJ_INT32)nump));
                    len = 0;
                    nump = 0;
                }
                ++pass;
            }

            ++cblk;
        }
    }

    if (!opj_bio_flush(bio)) {
        opj_bio_destroy(bio);
        return OPJ_FALSE;               /* modified to eliminate longjmp !! */
    }

    l_nb_bytes = (OPJ_UINT32)opj_bio_numbytes(bio);
    c += l_nb_bytes;
    length -= l_nb_bytes;

    opj_bio_destroy(bio);

    /* <EPH 0xff92> */
    if (tcp->csty & J2K_CP_CSTY_EPH) {
        if (length < 2) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 2);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 146;
        c += 2;
        length -= 2;
    }
    /* </EPH> */

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
       Will be updated later by incrementing with packet start value*/
    if (cstr_info && cstr_info->index_write) {
        opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
        info_PK->end_ph_pos = (OPJ_INT32)(c - dest);
    }
    /* INDEX >> */

    /* Writing the packet body */
    band = res->bands;
    for (bandno = 0; !packet_empty && bandno < res->numbands; bandno++, ++band) {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            if (layer->len > length) {
                if (p_t2_mode == FINAL_PASS) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "opj_t2_encode_packet(): only %u bytes remaining in "
                                  "output buffer. %u needed.\n",
                                  length, layer->len);
                }
                return OPJ_FALSE;
            }

            memcpy(c, layer->data, layer->len);
            cblk->numpasses += layer->numpasses;
            c += layer->len;
            length -= layer->len;

            /* << INDEX */
            if (cstr_info && cstr_info->index_write) {
                opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
                info_PK->disto += layer->disto;
                if (cstr_info->D_max < info_PK->disto) {
                    cstr_info->D_max = info_PK->disto;
                }
            }

            ++cblk;
            /* INDEX >> */
        }
    }

    assert(c >= dest);
    * p_data_written += (OPJ_UINT32)(c - dest);

    return OPJ_TRUE;
}